

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowLeadLagExecutor::EvaluateInternal
          (WindowLeadLagExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  WindowLeadLagExecutor *pWVar4;
  int iVar5;
  uint uVar6;
  type pWVar7;
  reference pvVar8;
  reference pvVar9;
  pointer this_00;
  idx_t iVar10;
  long lVar11;
  long lVar12;
  unsigned_long uVar13;
  pointer this_01;
  ValidityMask *pVVar14;
  pointer pEVar15;
  BoundWindowExpression *pBVar16;
  idx_t i;
  idx_t iVar17;
  WindowExecutorLocalState *pWVar18;
  unsigned_long width;
  ulong uVar19;
  WindowExecutor **this_02;
  ulong uVar20;
  bool bVar21;
  byte bVar22;
  pair<unsigned_long,_unsigned_long> pVar23;
  idx_t delta;
  WindowExecutorLocalState *local_a0;
  data_ptr_t local_98;
  idx_t local_90;
  WindowLeadLagExecutor *local_88;
  DataChunk *local_80;
  type local_78;
  WindowExecutor **local_70;
  ulong local_68;
  WindowInputExpression leadlag_default;
  WindowInputExpression leadlag_offset;
  
  local_90 = count;
  pWVar7 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
           operator*(&lstate[0x15].range_cursor);
  local_78 = pWVar7;
  WindowInputExpression::WindowInputExpression
            (&leadlag_offset,eval_chunk,(this->super_WindowValueExecutor).offset_idx);
  WindowInputExpression::WindowInputExpression
            (&leadlag_default,eval_chunk,(this->super_WindowValueExecutor).default_idx);
  pWVar18 = lstate + 2;
  local_88 = this;
  if (gstate[2].order_mask == (ValidityMask *)0x0) {
    pvVar8 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pWVar18,0);
    local_98 = pvVar8->data;
    pvVar8 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pWVar18,1);
    pdVar1 = pvVar8->data;
    this_02 = &gstate[2].executor;
    pVVar14 = optional_ptr<duckdb::ValidityMask,_true>::operator->
                        ((optional_ptr<duckdb::ValidityMask,_true> *)this_02);
    puVar2 = (pVVar14->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    pBVar16 = (this->super_WindowValueExecutor).super_WindowExecutor.wexpr;
    _Var3._M_head_impl =
         (pBVar16->offset_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    bVar22 = puVar2 == (unsigned_long *)0x0 && _Var3._M_head_impl == (Expression *)0x0;
    if (_Var3._M_head_impl != (Expression *)0x0 && puVar2 == (unsigned_long *)0x0) {
      pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pBVar16->offset_expr);
      iVar5 = (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar15);
      bVar22 = (byte)iVar5;
      pBVar16 = (this->super_WindowValueExecutor).super_WindowExecutor.wexpr;
    }
    _Var3._M_head_impl =
         (pBVar16->default_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    uVar6 = (uint)(_Var3._M_head_impl == (Expression *)0x0 & bVar22);
    if ((_Var3._M_head_impl != (Expression *)0x0) && (bVar22 != 0)) {
      pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pBVar16->default_expr);
      uVar6 = (*(pEVar15->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar15);
    }
    local_68 = local_90 + row_idx;
    local_80 = &pWVar7->chunk;
    iVar17 = 0;
    local_a0 = (WindowExecutorLocalState *)CONCAT71(local_a0._1_7_,(char)uVar6);
    local_70 = this_02;
    while (pWVar4 = local_88, iVar17 < local_90) {
      pBVar16 = (local_88->super_WindowValueExecutor).super_WindowExecutor.wexpr;
      lVar12 = 1;
      if ((pBVar16->offset_expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
        lVar12 = WindowInputExpression::GetCell<long>(&leadlag_offset,iVar17);
        pBVar16 = (pWVar4->super_WindowValueExecutor).super_WindowExecutor.wexpr;
      }
      if ((pBVar16->super_Expression).super_BaseExpression.type == WINDOW_LEAD) {
        iVar10 = AddOperatorOverflowCheck::Operation<long,long,long>(row_idx,lVar12);
      }
      else {
        iVar10 = SubtractOperatorOverflowCheck::Operation<long,long,long>(row_idx,lVar12);
      }
      delta = 0;
      if ((long)iVar10 < (long)row_idx) {
        delta = row_idx - iVar10;
        pVVar14 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)this_02);
        iVar10 = WindowBoundariesState::FindPrevStart
                           (pVVar14,*(idx_t *)(local_98 + iVar17 * 8),row_idx,&delta);
      }
      else if (iVar10 - row_idx != 0 && (long)row_idx <= (long)iVar10) {
        delta = iVar10 - row_idx;
        pVVar14 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)this_02);
        iVar10 = WindowBoundariesState::FindNextStart
                           (pVVar14,row_idx + 1,*(idx_t *)(pdVar1 + iVar17 * 8),&delta);
      }
      if ((char)uVar6 == '\0') {
        if (delta == 0) {
          uVar13 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar10);
          WindowCursor::CopyCell(local_78,0,uVar13,result,iVar17);
        }
        else if ((((pWVar4->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl ==
                 (Expression *)0x0) {
          FlatVector::SetNull(result,iVar17,true);
        }
        else {
          WindowInputExpression::CopyCell(&leadlag_default,result,iVar17,1);
        }
        iVar17 = iVar17 + 1;
        row_idx = row_idx + 1;
      }
      else {
        uVar19 = *(ulong *)(pdVar1 + iVar17 * 8);
        if (local_68 <= *(ulong *)(pdVar1 + iVar17 * 8)) {
          uVar19 = local_68;
        }
        uVar19 = uVar19 - row_idx;
        if (delta == 0) {
          uVar13 = NumericCastImpl<unsigned_long,_long,_false>::Convert(iVar10);
          uVar20 = *(long *)(pdVar1 + iVar17 * 8) - uVar13;
          if (uVar19 <= *(long *)(pdVar1 + iVar17 * 8) - uVar13) {
            uVar20 = uVar19;
          }
          for (; pWVar7 = local_78, this_02 = local_70, uVar20 != 0; uVar20 = uVar20 - uVar19) {
            iVar10 = WindowCursor::Seek(local_78,uVar13);
            pvVar8 = vector<duckdb::Vector,_true>::get<true>(&local_80->data,0);
            uVar19 = (pWVar7->chunk).count - iVar10;
            if (uVar20 <= uVar19) {
              uVar19 = uVar20;
            }
            VectorOperations::Copy(pvVar8,result,iVar10 + uVar19,iVar10,iVar17);
            iVar17 = iVar17 + uVar19;
            row_idx = row_idx + uVar19;
            uVar13 = uVar13 + uVar19;
          }
LAB_01aacef6:
          uVar6 = (uint)(byte)local_a0;
        }
        else {
          if (delta < uVar19) {
            uVar19 = delta;
          }
          if ((((pWVar4->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0)
          {
            WindowInputExpression::CopyCell(&leadlag_default,result,iVar17,uVar19);
            iVar17 = iVar17 + uVar19;
            row_idx = row_idx + uVar19;
            goto LAB_01aacef6;
          }
          uVar6 = (uint)(byte)local_a0;
          iVar10 = uVar19;
          while (bVar21 = iVar10 != 0, iVar10 = iVar10 - 1, bVar21) {
            FlatVector::SetNull(result,iVar17,true);
            iVar17 = iVar17 + 1;
          }
          row_idx = row_idx + uVar19;
          this_02 = local_70;
        }
      }
    }
  }
  else {
    local_80 = (DataChunk *)&gstate[2].order_mask;
    pvVar8 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pWVar18,6);
    pdVar1 = pvVar8->data;
    pvVar8 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)pWVar18,7);
    local_98 = pvVar8->data;
    pWVar18 = lstate + 0x14;
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)pWVar18,1);
    local_a0 = pWVar18;
    pvVar9 = vector<duckdb::FrameBounds,_true>::get<true>
                       ((vector<duckdb::FrameBounds,_true> *)pWVar18,0);
    for (iVar17 = 0; local_90 != iVar17; iVar17 = iVar17 + 1) {
      iVar10 = *(idx_t *)(local_98 + iVar17 * 8);
      pvVar9->start = *(idx_t *)(pdVar1 + iVar17 * 8);
      pvVar9->end = iVar10;
      this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                              *)local_80);
      iVar10 = WindowTokenTree::Rank(this_00,pvVar9->start,pvVar9->end,iVar17 + row_idx);
      lVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar10 - 1);
      pWVar4 = local_88;
      pBVar16 = (local_88->super_WindowValueExecutor).super_WindowExecutor.wexpr;
      lVar12 = 1;
      if ((pBVar16->offset_expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
        lVar12 = WindowInputExpression::GetCell<long>(&leadlag_offset,iVar17);
        pBVar16 = (pWVar4->super_WindowValueExecutor).super_WindowExecutor.wexpr;
      }
      if ((pBVar16->super_Expression).super_BaseExpression.type == WINDOW_LEAD) {
        lVar12 = AddOperatorOverflowCheck::Operation<long,long,long>(lVar11,lVar12);
      }
      else {
        lVar12 = SubtractOperatorOverflowCheck::Operation<long,long,long>(lVar11,lVar12);
      }
      lVar11 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar9->end - pvVar9->start);
      if ((lVar12 < 0) || (lVar11 <= lVar12)) {
        if ((((local_88->super_WindowValueExecutor).super_WindowExecutor.wexpr)->default_expr).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl == (Expression *)0x0)
        goto LAB_01aacc32;
        WindowInputExpression::CopyCell(&leadlag_default,result,iVar17,1);
      }
      else {
        uVar13 = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar12);
        this_01 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                *)&gstate[2].partition_mask);
        pVar23 = WindowIndexTree::SelectNth(this_01,(SubFrames *)local_a0,uVar13);
        if (pVar23.second == 0) {
          WindowCursor::CopyCell(local_78,0,pVar23.first,result,iVar17);
        }
        else {
LAB_01aacc32:
          FlatVector::SetNull(result,iVar17,true);
        }
      }
    }
  }
  return;
}

Assistant:

void WindowLeadLagExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                             DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &glstate = gstate.Cast<WindowLeadLagGlobalState>();
	auto &llstate = lstate.Cast<WindowLeadLagLocalState>();
	auto &cursor = *llstate.cursor;

	WindowInputExpression leadlag_offset(eval_chunk, offset_idx);
	WindowInputExpression leadlag_default(eval_chunk, default_idx);

	if (glstate.row_tree) {
		auto frame_begin = FlatVector::GetData<const idx_t>(llstate.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(llstate.bounds.data[FRAME_END]);
		// TODO: Handle subframes.
		auto &frames = llstate.frames;
		frames.resize(1);
		auto &frame = frames[0];
		for (idx_t i = 0; i < count; ++i, ++row_idx) {
			// (1) compute the ROW_NUMBER of the own row
			frame = FrameBounds(frame_begin[i], frame_end[i]);
			const auto own_row = glstate.row_tree->Rank(frame.start, frame.end, row_idx) - 1;
			// (2) adjust the row number by adding or subtracting an offset
			auto val_idx = NumericCast<int64_t>(own_row);
			int64_t offset = 1;
			if (wexpr.offset_expr) {
				offset = leadlag_offset.GetCell<int64_t>(i);
			}
			if (wexpr.GetExpressionType() == ExpressionType::WINDOW_LEAD) {
				val_idx = AddOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
			} else {
				val_idx = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
			}
			const auto frame_width = NumericCast<int64_t>(frame.end - frame.start);
			if (val_idx >= 0 && val_idx < frame_width) {
				// (3) find the row at that offset
				const auto n = NumericCast<idx_t>(val_idx);
				const auto nth_index = glstate.value_tree->SelectNth(frames, n);
				// (4) evaluate the expression provided to LEAD/LAG on this row.
				if (nth_index.second) {
					//	Overflow
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, nth_index.first, result, i);
				}
			} else if (wexpr.default_expr) {
				leadlag_default.CopyCell(result, i);
			} else {
				FlatVector::SetNull(result, i, true);
			}
		}
		return;
	}

	auto partition_begin = FlatVector::GetData<const idx_t>(llstate.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(llstate.bounds.data[PARTITION_END]);

	auto &ignore_nulls = glstate.ignore_nulls;
	bool can_shift = ignore_nulls->AllValid();
	if (wexpr.offset_expr) {
		can_shift = can_shift && wexpr.offset_expr->IsFoldable();
	}
	if (wexpr.default_expr) {
		can_shift = can_shift && wexpr.default_expr->IsFoldable();
	}

	const auto row_end = row_idx + count;
	for (idx_t i = 0; i < count;) {
		int64_t offset = 1;
		if (wexpr.offset_expr) {
			offset = leadlag_offset.GetCell<int64_t>(i);
		}
		int64_t val_idx = (int64_t)row_idx;
		if (wexpr.GetExpressionType() == ExpressionType::WINDOW_LEAD) {
			val_idx = AddOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
		} else {
			val_idx = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(val_idx, offset);
		}

		idx_t delta = 0;
		if (val_idx < (int64_t)row_idx) {
			// Count backwards
			delta = idx_t(row_idx - idx_t(val_idx));
			val_idx = int64_t(WindowBoundariesState::FindPrevStart(*ignore_nulls, partition_begin[i], row_idx, delta));
		} else if (val_idx > (int64_t)row_idx) {
			delta = idx_t(idx_t(val_idx) - row_idx);
			val_idx =
			    int64_t(WindowBoundariesState::FindNextStart(*ignore_nulls, row_idx + 1, partition_end[i], delta));
		}
		// else offset is zero, so don't move.

		if (can_shift) {
			const auto target_limit = MinValue(partition_end[i], row_end) - row_idx;
			if (!delta) {
				//	Copy source[index:index+width] => result[i:]
				auto index = NumericCast<idx_t>(val_idx);
				const auto source_limit = partition_end[i] - index;
				auto width = MinValue(source_limit, target_limit);
				// We may have to scan multiple blocks here, so loop until we have copied everything
				const idx_t col_idx = 0;
				while (width) {
					const auto source_offset = cursor.Seek(index);
					auto &source = cursor.chunk.data[col_idx];
					const auto copied = MinValue<idx_t>(cursor.chunk.size() - source_offset, width);
					VectorOperations::Copy(source, result, source_offset + copied, source_offset, i);
					i += copied;
					row_idx += copied;
					index += copied;
					width -= copied;
				}
			} else if (wexpr.default_expr) {
				const auto width = MinValue(delta, target_limit);
				leadlag_default.CopyCell(result, i, width);
				i += width;
				row_idx += width;
			} else {
				for (idx_t nulls = MinValue(delta, target_limit); nulls--; ++i, ++row_idx) {
					FlatVector::SetNull(result, i, true);
				}
			}
		} else {
			if (!delta) {
				cursor.CopyCell(0, NumericCast<idx_t>(val_idx), result, i);
			} else if (wexpr.default_expr) {
				leadlag_default.CopyCell(result, i);
			} else {
				FlatVector::SetNull(result, i, true);
			}
			++i;
			++row_idx;
		}
	}
}